

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

ptrlen pty_backend_exit_signame(Backend *be,char **aux_msg)

{
  uint __sig;
  char *pcVar1;
  int sig;
  char **aux_msg_local;
  Backend *be_local;
  
  *aux_msg = (char *)0x0;
  __sig = pty_backend_exit_signum(be);
  if ((int)__sig < 0) {
    _be_local = make_ptrlen("",0);
  }
  else if (__sig == 2) {
    _be_local = make_ptrlen("INT",3);
  }
  else if (__sig == 0xf) {
    _be_local = make_ptrlen("TERM",4);
  }
  else if (__sig == 9) {
    _be_local = make_ptrlen("KILL",4);
  }
  else if (__sig == 3) {
    _be_local = make_ptrlen("QUIT",4);
  }
  else if (__sig == 1) {
    _be_local = make_ptrlen("HUP",3);
  }
  else if (__sig == 6) {
    _be_local = make_ptrlen("ABRT",4);
  }
  else if (__sig == 0xe) {
    _be_local = make_ptrlen("ALRM",4);
  }
  else if (__sig == 8) {
    _be_local = make_ptrlen("FPE",3);
  }
  else if (__sig == 4) {
    _be_local = make_ptrlen("ILL",3);
  }
  else if (__sig == 0xd) {
    _be_local = make_ptrlen("PIPE",4);
  }
  else if (__sig == 0xb) {
    _be_local = make_ptrlen("SEGV",4);
  }
  else if (__sig == 10) {
    _be_local = make_ptrlen("USR1",4);
  }
  else if (__sig == 0xc) {
    _be_local = make_ptrlen("USR2",4);
  }
  else {
    pcVar1 = strsignal(__sig);
    pcVar1 = dupprintf("untranslatable signal number %d: %s",(ulong)__sig,pcVar1);
    *aux_msg = pcVar1;
    _be_local = make_ptrlen("HUP",3);
  }
  return _be_local;
}

Assistant:

ptrlen pty_backend_exit_signame(Backend *be, char **aux_msg)
{
    *aux_msg = NULL;

    int sig = pty_backend_exit_signum(be);
    if (sig < 0)
        return PTRLEN_LITERAL("");

    #define SIGNAL_SUB(s) {                             \
        if (sig == SIG ## s)                            \
            return PTRLEN_LITERAL(#s);                  \
    }
    #define SIGNAL_MAIN(s, desc) SIGNAL_SUB(s)
    #define SIGNALS_LOCAL_ONLY
    #include "ssh/signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB
    #undef SIGNALS_LOCAL_ONLY

    *aux_msg = dupprintf("untranslatable signal number %d: %s",
                         sig, strsignal(sig));
    return PTRLEN_LITERAL("HUP");      /* need some kind of default */
}